

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coalesce.c
# Opt level: O1

int inform_coalesce(int *series,size_t n,int *coal,inform_error *err)

{
  undefined4 *__dest;
  size_t sVar1;
  undefined4 *__base;
  void *pvVar2;
  long lVar3;
  size_t sVar4;
  int iVar5;
  
  if (series != (int *)0x0) {
    if (n == 0) {
      if (err == (inform_error *)0x0) {
        return 0;
      }
      *err = INFORM_ESHORTSERIES;
      return 0;
    }
    if (coal != (int *)0x0) {
      __dest = (undefined4 *)malloc(n * 4);
      if (__dest != (undefined4 *)0x0) {
        memcpy(__dest,series,n * 4);
        qsort(__dest,n,4,compare_ints);
        iVar5 = 1;
        if (n != 1) {
          sVar1 = 1;
          do {
            iVar5 = iVar5 + (uint)(__dest[sVar1] != __dest[sVar1 - 1]);
            sVar1 = sVar1 + 1;
          } while (n != sVar1);
        }
        __base = (undefined4 *)malloc((long)iVar5 * 4);
        if (__base != (undefined4 *)0x0) {
          *__base = *__dest;
          if (n != 1) {
            sVar1 = 2;
            if (2 < n) {
              sVar1 = n;
            }
            lVar3 = 1;
            sVar4 = 1;
            do {
              if (__dest[sVar4] != __dest[sVar4 - 1]) {
                __base[lVar3] = __dest[sVar4];
                lVar3 = lVar3 + 1;
              }
              sVar4 = sVar4 + 1;
            } while (sVar1 != sVar4);
          }
          free(__dest);
          lVar3 = 0;
          while( true ) {
            pvVar2 = bsearch(series,__base,(long)iVar5,4,compare_ints);
            if (pvVar2 == (void *)0x0) {
              free(__base);
              if (err != (inform_error *)0x0) {
                *err = INFORM_EBIN;
              }
            }
            else {
              coal[lVar3] = (int)((ulong)((long)pvVar2 - (long)__base) >> 2);
            }
            if (pvVar2 == (void *)0x0) break;
            lVar3 = lVar3 + 1;
            series = series + 1;
            if (n + (n == 0) == lVar3) {
              free(__base);
              return iVar5;
            }
          }
          return 0;
        }
        free(__dest);
      }
      if (err == (inform_error *)0x0) {
        return 0;
      }
      *err = INFORM_ENOMEM;
      return 0;
    }
  }
  if (err != (inform_error *)0x0) {
    *err = INFORM_ETIMESERIES;
  }
  return 0;
}

Assistant:

int inform_coalesce(int const *series, size_t n, int *coal, inform_error *err)
{
    if (series == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0);
    else if (n == 0)
        INFORM_ERROR_RETURN(err, INFORM_ESHORTSERIES, 0);
    else if (coal == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0);

    int *tmp = malloc(n * sizeof(int));
    if (tmp == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, 0);
    }
    memcpy(tmp, series, n * sizeof(int));
    qsort(tmp, n, sizeof(int), compare_ints);
    int b = 1;
    for (size_t i = 1; i < n; ++i)
    {
        if (tmp[i] != tmp[i-1]) ++b;
    }

    int *map = malloc(b * sizeof(int));
    if (map == NULL)
    {
        free(tmp);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, 0);
    }
    map[0] = tmp[0];
    for (size_t i = 1, j = 1; i < n; ++i)
    {
        if (tmp[i] != tmp[i-1]) map[j++] = tmp[i];
    }
    free(tmp);

    for (size_t i = 0; i < n; ++i)
    {
        int *x = bsearch(series + i, map, b, sizeof(int), compare_ints);
        if (x == NULL)
        {
            free(map);
            INFORM_ERROR_RETURN(err, INFORM_EBIN, 0);
        }
        coal[i] = (int) (x - map);
    }

    free(map);
    return b;
}